

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDFWriter::getTrimmedTrailer(QPDFWriter *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  allocator<char> local_31;
  string local_30;
  
  QPDF::getTrailer((QPDF *)&local_30);
  QPDFObjectHandle::unsafeShallowCopy((QPDFObjectHandle *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_30._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/ID",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Encrypt",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Prev",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Index",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/W",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Length",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Filter",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/DecodeParms",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/Type",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"/XRefStm",&local_31);
  QPDFObjectHandle::removeKey((QPDFObjectHandle *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFWriter::getTrimmedTrailer()
{
    // Remove keys from the trailer that necessarily have to be replaced when writing the file.

    QPDFObjectHandle trailer = m->pdf.getTrailer().unsafeShallowCopy();

    // Remove encryption keys
    trailer.removeKey("/ID");
    trailer.removeKey("/Encrypt");

    // Remove modification information
    trailer.removeKey("/Prev");

    // Remove all trailer keys that potentially come from a cross-reference stream
    trailer.removeKey("/Index");
    trailer.removeKey("/W");
    trailer.removeKey("/Length");
    trailer.removeKey("/Filter");
    trailer.removeKey("/DecodeParms");
    trailer.removeKey("/Type");
    trailer.removeKey("/XRefStm");

    return trailer;
}